

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackScriptFunction.cpp
# Opt level: O1

ScriptFunction *
Js::StackScriptFunction::OP_NewStackScFunc
          (FrameDisplay *environment,FunctionInfoPtrPtr infoRef,ScriptFunction *stackFunction)

{
  FunctionBody *this;
  code *pcVar1;
  bool bVar2;
  uint sourceContextId;
  int iVar3;
  undefined4 *puVar4;
  FunctionInfo *pFVar5;
  undefined4 extraout_var;
  ScriptFunction *pSVar6;
  char16 *pcVar7;
  char16_t *pcVar8;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  
  if (stackFunction == (ScriptFunction *)0x0) {
    pSVar6 = ScriptFunction::OP_NewScFunc(environment,infoRef);
    return pSVar6;
  }
  this = (FunctionBody *)(infoRef->ptr->functionBodyImpl).ptr;
  if (this == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                ,0x2ec,"(functionProxy != nullptr)",
                                "BYTE-CODE VERIFY: Must specify a valid function to create");
    if (!bVar2) goto LAB_00d60a66;
    *puVar4 = 0;
  }
  if ((FunctionBody *)
      (((stackFunction->super_ScriptFunctionBase).super_JavascriptFunction.functionInfo.ptr)->
      functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                ,0x2ed,
                                "(stackFunction->GetFunctionInfo()->GetFunctionProxy() == functionProxy)"
                                ,
                                "stackFunction->GetFunctionInfo()->GetFunctionProxy() == functionProxy"
                               );
    if (!bVar2) goto LAB_00d60a66;
    *puVar4 = 0;
  }
  bVar2 = FunctionProxy::IsFunctionBody((FunctionProxy *)this);
  if (bVar2) {
    bVar2 = FunctionProxy::IsFunctionBody((FunctionProxy *)this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
      if (!bVar2) goto LAB_00d60a66;
      *puVar4 = 0;
    }
    pFVar5 = FunctionBody::GetStackNestedFuncParentStrongRef(this);
    if (pFVar5 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/StackScriptFunction.cpp"
                                  ,0x2ee,
                                  "(!functionProxy->IsFunctionBody() || functionProxy->GetFunctionBody()->GetStackNestedFuncParentStrongRef() != nullptr)"
                                  ,
                                  "!functionProxy->IsFunctionBody() || functionProxy->GetFunctionBody()->GetStackNestedFuncParentStrongRef() != nullptr"
                                 );
      if (!bVar2) goto LAB_00d60a66;
      *puVar4 = 0;
    }
  }
  ScriptFunction::SetEnvironment(stackFunction,environment);
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this);
  if ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
      (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_00d60a66;
    *puVar4 = 0;
  }
  bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,StackFuncPhase,sourceContextId,
                            ((this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                            ptr)->functionId);
  if ((bVar2) && (DAT_015d346a == '\x01')) {
    bVar2 = FunctionProxy::IsFunctionBody((FunctionProxy *)this);
    if (bVar2) {
      bVar2 = FunctionProxy::IsFunctionBody((FunctionProxy *)this);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
        if (!bVar2) {
LAB_00d60a66:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
      iVar3 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
      pcVar8 = (char16_t *)CONCAT44(extraout_var,iVar3);
    }
    else {
      pcVar8 = L"<deferred>";
    }
    pcVar7 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_88);
    Output::Print(L"Stack alloc nested function: %s %s (address: %p)\n",pcVar8,pcVar7,stackFunction)
    ;
    Output::Flush();
  }
  return stackFunction;
}

Assistant:

ScriptFunction * StackScriptFunction::OP_NewStackScFunc(FrameDisplay *environment, FunctionInfoPtrPtr infoRef, ScriptFunction * stackFunction)
    {
        if (stackFunction)
        {
#if ENABLE_DEBUG_CONFIG_OPTIONS
            char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif

            FunctionProxy* functionProxy = (*infoRef)->GetFunctionProxy();
            AssertMsg(functionProxy != nullptr, "BYTE-CODE VERIFY: Must specify a valid function to create");
            Assert(stackFunction->GetFunctionInfo()->GetFunctionProxy() == functionProxy);
            Assert(!functionProxy->IsFunctionBody() || functionProxy->GetFunctionBody()->GetStackNestedFuncParentStrongRef() != nullptr);
            stackFunction->SetEnvironment(environment);


            PHASE_PRINT_VERBOSE_TRACE(Js::StackFuncPhase, functionProxy,
                _u("Stack alloc nested function: %s %s (address: %p)\n"),
                    functionProxy->IsFunctionBody()?
                        functionProxy->GetFunctionBody()->GetDisplayName() : _u("<deferred>"),
                        functionProxy->GetDebugNumberSet(debugStringBuffer), stackFunction);
            return stackFunction;
        }
        return ScriptFunction::OP_NewScFunc(environment, infoRef);
    }